

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  bool bVar2;
  uint uVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  SPIRVariable *pSVar6;
  SPIRType *pSVar7;
  Bitset *pBVar8;
  key_type local_50;
  undefined4 uStack_4c;
  undefined1 local_40 [16];
  
  local_50.id = id;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = (ulong)id;
  bVar2 = true;
  if ((uVar5 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar5].type == TypeVariable)) {
    pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar5);
    if ((pSVar6->storage == StorageClassWorkgroup) && ((this->backend).shared_is_implied == false))
    {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    bVar2 = false;
  }
  else {
    pSVar6 = (SPIRVariable *)0x0;
  }
  pBVar8 = &(pmVar4->decoration).decoration_flags;
  (*(this->super_Compiler)._vptr_Compiler[0x2e])(&local_50,this,pBVar8);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,CONCAT44(uStack_4c,local_50.id));
  if ((undefined1 *)CONCAT44(uStack_4c,local_50.id) != local_40) {
    operator_delete((undefined1 *)CONCAT44(uStack_4c,local_50.id));
  }
  if (!bVar2) {
    (*(this->super_Compiler)._vptr_Compiler[0x2c])(this,pSVar6);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pSVar7 = Compiler::expression_type(&this->super_Compiler,id);
  if (((pSVar7->image).dim != DimSubpassData) && ((pSVar7->image).sampled == 2)) {
    uVar3 = (uint)pBVar8->lower;
    if ((uVar3 >> 0x17 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar3 = (uint)pBVar8->lower;
    }
    if ((uVar3 >> 0x13 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar3 = (uint)pBVar8->lower;
    }
    if ((uVar3 >> 0x18 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar3 = (uint)pBVar8->lower;
    }
    if ((uVar3 >> 0x19 & 1) != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  to_precision_qualifiers_glsl(this,id);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_qualifiers_glsl(uint32_t id)
{
	auto &flags = ir.meta[id].decoration.decoration_flags;
	string res;

	auto *var = maybe_get<SPIRVariable>(id);

	if (var && var->storage == StorageClassWorkgroup && !backend.shared_is_implied)
		res += "shared ";

	res += to_interpolation_qualifiers(flags);
	if (var)
		res += to_storage_qualifiers_glsl(*var);

	auto &type = expression_type(id);
	if (type.image.dim != DimSubpassData && type.image.sampled == 2)
	{
		if (flags.get(DecorationCoherent))
			res += "coherent ";
		if (flags.get(DecorationRestrict))
			res += "restrict ";
		if (flags.get(DecorationNonWritable))
			res += "readonly ";
		if (flags.get(DecorationNonReadable))
			res += "writeonly ";
	}

	res += to_precision_qualifiers_glsl(id);

	return res;
}